

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_189743::CBBTest_StickyError_Test::TestBody(CBBTest_StickyError_Test *this)

{
  int iVar1;
  char *in_R9;
  size_t len;
  uint8_t *ptr;
  uint8_t buf;
  ScopedCBB cbb;
  CBB child;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  AssertHelper local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  string local_a8;
  AssertHelper local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  uint8_t local_71;
  CBB local_70;
  CBB local_40;
  
  CBB_zero(&local_70);
  iVar1 = CBB_init(&local_70,0);
  local_c8[0] = (internal)(iVar1 != 0);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,local_c8,(AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4c0,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
LAB_0021c7c8:
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    local_b0._M_head_impl = local_80._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      local_b0._M_head_impl = local_80._M_head_impl;
    }
  }
  else {
    iVar1 = CBB_add_u8_length_prefixed(&local_70,&local_40);
    local_c8[0] = (internal)(iVar1 != 0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,local_c8,
                 (AssertionResult *)"CBB_add_u8_length_prefixed(cbb.get(), &child)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c1,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      goto LAB_0021c7c8;
    }
    iVar1 = CBB_add_bytes(&local_40,"",0x100);
    local_c8[0] = (internal)(iVar1 != 0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,local_c8,
                 (AssertionResult *)"CBB_add_bytes(&child, kZeros, sizeof(kZeros))","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c2,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      goto LAB_0021c7c8;
    }
    iVar1 = CBB_flush(&local_70);
    local_c8[0] = (internal)(iVar1 == 0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c8[0]) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,local_c8,(AssertionResult *)"CBB_flush(cbb.get())","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c3,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      goto LAB_0021c7c8;
    }
    iVar1 = CBB_add_u8(&local_70,'\0');
    local_c8[0] = (internal)(iVar1 == 0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c8[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,local_c8,(AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c8,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
    }
    iVar1 = CBB_finish(&local_70,(uint8_t **)&local_80,(size_t *)&local_88);
    local_c8[0] = (internal)(iVar1 == 0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c8[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,local_c8,(AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4c9,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
    }
    CBB_cleanup(&local_70);
    CBB_zero(&local_70);
    iVar1 = CBB_init_fixed(&local_70,&local_71,1);
    local_c8[0] = (internal)(iVar1 != 0);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,local_c8,(AssertionResult *)"CBB_init_fixed(cbb.get(), &buf, 1)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4ce,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    }
    else {
      iVar1 = CBB_add_bytes(&local_70,"",0x100);
      local_c8[0] = (internal)(iVar1 == 0);
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_c8[0]) {
        iVar1 = CBB_add_u8(&local_70,'\0');
        local_c8[0] = (internal)(iVar1 == 0);
        local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_c8[0]) {
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,local_c8,(AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true","false"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d2,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,local_c0);
          }
        }
        iVar1 = CBB_finish(&local_70,(uint8_t **)&local_80,(size_t *)&local_88);
        local_c8[0] = (internal)(iVar1 == 0);
        local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_c8[0]) {
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,local_c8,(AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d3,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,local_c0);
          }
        }
        CBB_cleanup(&local_70);
        CBB_zero(&local_70);
        iVar1 = CBB_init(&local_70,0);
        local_c8[0] = (internal)(iVar1 != 0);
        local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_a8,local_c8,(AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x4d7,local_a8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
        }
        else {
          iVar1 = CBB_add_u24(&local_70,0x1000000);
          local_c8[0] = (internal)(iVar1 == 0);
          local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_c8[0]) {
            iVar1 = CBB_add_u8(&local_70,'\0');
            local_c8[0] = (internal)(iVar1 == 0);
            local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_c8[0]) {
              testing::Message::Message((Message *)&local_b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_a8,local_c8,(AssertionResult *)"CBB_add_u8(cbb.get(), 0)","true",
                         "false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x4db,local_a8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
              testing::internal::AssertHelper::~AssertHelper(&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_b0._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_b0._M_head_impl + 8))();
              }
              if (local_c0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_c0,local_c0);
              }
            }
            iVar1 = CBB_finish(&local_70,(uint8_t **)&local_80,(size_t *)&local_88);
            local_c8[0] = (internal)(iVar1 == 0);
            local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_c8[0]) goto LAB_0021c80f;
            testing::Message::Message((Message *)&local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a8,local_c8,(AssertionResult *)"CBB_finish(cbb.get(), &ptr, &len)",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4dc,local_a8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
          }
          else {
            testing::Message::Message((Message *)&local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_a8,local_c8,(AssertionResult *)"CBB_add_u24(cbb.get(), 1u << 24)",
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x4d8,local_a8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a8,local_c8,
                   (AssertionResult *)"CBB_add_bytes(cbb.get(), kZeros, sizeof(kZeros))","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x4cf,local_a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_b0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_b0._M_head_impl + 8))();
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
LAB_0021c80f:
  CBB_cleanup(&local_70);
  return;
}

Assistant:

TEST(CBBTest, StickyError) {
  // Write an input that exceeds the limit for its length prefix.
  bssl::ScopedCBB cbb;
  CBB child;
  static const uint8_t kZeros[256] = {0};
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_TRUE(CBB_add_u8_length_prefixed(cbb.get(), &child));
  ASSERT_TRUE(CBB_add_bytes(&child, kZeros, sizeof(kZeros)));
  ASSERT_FALSE(CBB_flush(cbb.get()));

  // All future operations should fail.
  uint8_t *ptr;
  size_t len;
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));

  // Write an input that cannot fit in a fixed CBB.
  cbb.Reset();
  uint8_t buf;
  ASSERT_TRUE(CBB_init_fixed(cbb.get(), &buf, 1));
  ASSERT_FALSE(CBB_add_bytes(cbb.get(), kZeros, sizeof(kZeros)));

  // All future operations should fail.
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));

  // Write a u32 that cannot fit in a u24.
  cbb.Reset();
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_FALSE(CBB_add_u24(cbb.get(), 1u << 24));

  // All future operations should fail.
  EXPECT_FALSE(CBB_add_u8(cbb.get(), 0));
  EXPECT_FALSE(CBB_finish(cbb.get(), &ptr, &len));
}